

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O3

bool __thiscall asl::String::equalsNocase(String *this,String *s)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  Enumerator e2;
  Enumerator e1;
  Enumerator local_48;
  Enumerator local_38;
  
  if (this->_size == 0) {
    local_38.u = (char *)&this->field_2;
  }
  else {
    local_38.u = (this->field_2)._str;
  }
  local_38.n = 1;
  if (s->_size == 0) {
    local_48.u = (char *)&s->field_2;
  }
  else {
    local_48.u = (s->field_2)._str;
  }
  local_48.n = 1;
  if (*local_38.u != '\0') {
    do {
      if (*local_48.u == '\0') {
        return false;
      }
      iVar2 = Enumerator::operator*(&local_38);
      iVar3 = Enumerator::operator*(&local_48);
      if (iVar2 < 0x588 && iVar3 < 0x588) {
        if (toLowercaseU8[(long)iVar2 * 2] != toLowercaseU8[(long)iVar3 * 2]) {
          return false;
        }
        if (toLowercaseU8[(long)(iVar2 * 2) + 1] != toLowercaseU8[(long)(iVar3 * 2) + 1]) {
          return false;
        }
      }
      else if (iVar2 != iVar3) {
        return false;
      }
      local_48.u = local_48.u + local_48.n;
      pcVar1 = local_38.u + local_38.n;
      local_38.u = (char *)((long)local_38.u + (long)local_38.n);
    } while (*pcVar1 != '\0');
  }
  return *local_48.u == '\0';
}

Assistant:

const char* str() const {return (_size==0)? (const char*)_space : (const char*)_str;}